

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu541.c
# Opt level: O2

MPP_RET hal_h265e_v541_deinit(void *hal)

{
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v541","(%d) enter\n",(char *)0x0,0x294);
  }
  if (*(void **)((long)hal + 0x70) != (void *)0x0) {
    mpp_osal_free("hal_h265e_v541_deinit",*(void **)((long)hal + 0x70));
  }
  *(undefined8 *)((long)hal + 0x70) = 0;
  if (*(void **)((long)hal + 0x78) != (void *)0x0) {
    mpp_osal_free("hal_h265e_v541_deinit",*(void **)((long)hal + 0x78));
  }
  *(undefined8 *)((long)hal + 0x78) = 0;
  if (*(void **)((long)hal + 0x80) != (void *)0x0) {
    mpp_osal_free("hal_h265e_v541_deinit",*(void **)((long)hal + 0x80));
  }
  *(undefined8 *)((long)hal + 0x80) = 0;
  if (*(void **)((long)hal + 0x250) != (void *)0x0) {
    mpp_osal_free("hal_h265e_v541_deinit",*(void **)((long)hal + 0x250));
  }
  *(undefined8 *)((long)hal + 0x250) = 0;
  if (*(void **)((long)hal + 0x1f8) != (void *)0x0) {
    mpp_osal_free("hal_h265e_v541_deinit",*(void **)((long)hal + 0x1f8));
  }
  *(undefined8 *)((long)hal + 0x1f8) = 0;
  if (*(MppBuffer *)((long)hal + 0x208) != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x208),"hal_h265e_v541_deinit");
    *(undefined8 *)((long)hal + 0x208) = 0;
  }
  hal_bufs_deinit(*(HalBufs *)((long)hal + 0x270));
  if (*(MppBufferGroup *)((long)hal + 0x200) != (MppBufferGroup)0x0) {
    mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x200));
    *(undefined8 *)((long)hal + 0x200) = 0;
  }
  if (*(MppBuffer *)((long)hal + 0x230) != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x230),"hal_h265e_v541_deinit");
    *(undefined8 *)((long)hal + 0x230) = 0;
  }
  if (*(MppBuffer *)((long)hal + 0x238) != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x238),"hal_h265e_v541_deinit");
    *(undefined8 *)((long)hal + 0x238) = 0;
  }
  if (*(MppBufferGroup *)((long)hal + 0x228) != (MppBufferGroup)0x0) {
    mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x228));
    *(undefined8 *)((long)hal + 0x228) = 0;
  }
  if (*(MppDev *)((long)hal + 0x68) != (MppDev)0x0) {
    mpp_dev_deinit(*(MppDev *)((long)hal + 0x68));
    *(undefined8 *)((long)hal + 0x68) = 0;
  }
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v541","(%d) leave\n",(char *)0x0,0x2b9);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_v541_deinit(void *hal)
{
    H265eV541HalContext *ctx = (H265eV541HalContext *)hal;
    hal_h265e_enter();
    MPP_FREE(ctx->regs);
    MPP_FREE(ctx->l2_regs);
    MPP_FREE(ctx->reg_out);
    MPP_FREE(ctx->input_fmt);
    MPP_FREE(ctx->roi_buf_tmp);

    if (ctx->roi_buf) {
        mpp_buffer_put(ctx->roi_buf);
        ctx->roi_buf = NULL;
    }
    hal_bufs_deinit(ctx->dpb_bufs);

    if (ctx->roi_grp) {
        mpp_buffer_group_put(ctx->roi_grp);
        ctx->roi_grp = NULL;
    }

    if (ctx->hw_tile_buf[0]) {
        mpp_buffer_put(ctx->hw_tile_buf[0]);
        ctx->hw_tile_buf[0] = NULL;
    }

    if (ctx->hw_tile_buf[1]) {
        mpp_buffer_put(ctx->hw_tile_buf[1]);
        ctx->hw_tile_buf[1] = NULL;
    }

    if (ctx->tile_grp) {
        mpp_buffer_group_put(ctx->tile_grp);
        ctx->tile_grp = NULL;
    }

    if (ctx->dev) {
        mpp_dev_deinit(ctx->dev);
        ctx->dev = NULL;
    }
    hal_h265e_leave();
    return MPP_OK;
}